

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void teardown_testing(char *test_name)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  list_free((ListNode *)(lVar1 + -400),free_symbol_map_value,(void *)0x0);
  *(undefined8 *)(lVar1 + -0x170) = 0;
  *(undefined4 *)(lVar1 + -0x168) = 0;
  list_free((ListNode *)(lVar1 + -0x140),free_symbol_map_value,(void *)0x1);
  *(undefined8 *)(lVar1 + -0x120) = 0;
  *(undefined4 *)(lVar1 + -0x118) = 0;
  list_free((ListNode *)(lVar1 + -0x160),free_value,(void *)0x0);
  *(undefined8 *)(lVar1 + -0x18) = 0;
  *(undefined4 *)(lVar1 + -0x10) = 0;
  return;
}

Assistant:

static void teardown_testing(const char *test_name) {
    (void)test_name;
    list_free(&global_function_result_map_head, free_symbol_map_value,
              (void*)0);
    initialize_source_location(&global_last_mock_value_location);
    list_free(&global_function_parameter_map_head, free_symbol_map_value,
              (void*)1);
    initialize_source_location(&global_last_parameter_location);
    list_free(&global_call_ordering_head, free_value,
              (void*)0);
    initialize_source_location(&global_last_call_ordering_location);
}